

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser.hpp
# Opt level: O1

vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
* __thiscall
bioparser::SamParser<bioparser::test::SamOverlap>::Parse
          (vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
           *__return_storage_ptr__,SamParser<bioparser::test::SamOverlap> *this,uint64_t bytes,
          bool shorten_names)

{
  uint32_t *puVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t parsed_bytes;
  uint32_t quality_len;
  uint32_t data_len;
  uint32_t template_len;
  uint32_t t_next_begin;
  uint32_t t_next_name_len;
  uint32_t cigar_len;
  uint32_t map_quality;
  uint32_t t_begin;
  uint32_t t_name_len;
  uint32_t flag;
  uint32_t q_name_len;
  char *quality;
  char *data;
  char *t_next_name;
  char *cigar;
  char *t_name;
  char *q_name;
  anon_class_168_21_4e792969 create_T;
  bool local_151;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  *local_150;
  ulong local_148;
  uint64_t local_140;
  uint32_t local_134 [11];
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  anon_class_168_21_4e792969 local_d8;
  
  local_d8.shorten_names = &local_151;
  local_d8.q_name = &local_e0;
  local_e0 = (char *)0x0;
  local_d8.q_name_len = local_134 + 10;
  local_134[10] = 0;
  local_d8.flag = local_134 + 9;
  local_134[9] = 0;
  local_d8.t_name = &local_e8;
  local_e8 = (char *)0x0;
  local_d8.t_name_len = local_134 + 8;
  local_134[8] = 0;
  local_d8.t_begin = local_134 + 7;
  local_134[7] = 0;
  local_d8.map_quality = local_134 + 6;
  local_134[6] = 0;
  local_d8.cigar = &local_f0;
  local_f0 = (char *)0x0;
  local_d8.cigar_len = local_134 + 5;
  local_134[5] = 0;
  local_d8.t_next_name = &local_f8;
  local_f8 = (char *)0x0;
  local_d8.t_next_name_len = local_134 + 4;
  local_134[4] = 0;
  local_d8.t_next_begin = local_134 + 3;
  local_134[3] = 0;
  local_d8.template_len = local_134 + 2;
  local_134[2] = 0;
  local_d8.data = &local_100;
  local_100 = (char *)0x0;
  local_d8.data_len = local_134 + 1;
  local_134[1] = 0;
  local_d8.quality = &local_108;
  local_108 = (char *)0x0;
  local_d8.quality_len = local_134;
  local_134[0] = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.parsed_bytes = &local_140;
  local_148 = 0;
  local_140 = 0;
  bVar5 = false;
  local_151 = shorten_names;
  local_150 = __return_storage_ptr__;
  local_d8.this = this;
  local_d8.dst = __return_storage_ptr__;
  do {
    uVar6 = (this->super_Parser<bioparser::test::SamOverlap>).buffer_ptr_;
    uVar8 = (ulong)uVar6;
    uVar9 = uVar8;
    if (uVar6 < (this->super_Parser<bioparser::test::SamOverlap>).buffer_bytes_) {
      do {
        if ((this->super_Parser<bioparser::test::SamOverlap>).buffer_.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
            [uVar9] == '\n') {
          Parser<bioparser::test::SamOverlap>::Store
                    (&this->super_Parser<bioparser::test::SamOverlap>,
                     (ulong)((int)uVar8 -
                            (this->super_Parser<bioparser::test::SamOverlap>).buffer_ptr_),false);
          Parse::anon_class_168_21_4e792969::operator()(&local_d8);
          if (local_140 < bytes) goto LAB_00118803;
          bVar5 = true;
          bVar3 = false;
        }
        else {
LAB_00118803:
          bVar3 = true;
        }
        if (!bVar3) {
          iVar4 = 1;
          goto LAB_00118879;
        }
        uVar9 = uVar9 + 1;
        uVar6 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar6;
      } while (uVar9 < (this->super_Parser<bioparser::test::SamOverlap>).buffer_bytes_);
    }
    puVar1 = &(this->super_Parser<bioparser::test::SamOverlap>).buffer_ptr_;
    uVar7 = uVar6 - *puVar1;
    if (*puVar1 <= uVar6 && uVar7 != 0) {
      Parser<bioparser::test::SamOverlap>::Store
                (&this->super_Parser<bioparser::test::SamOverlap>,(ulong)uVar7,false);
    }
    iVar4 = 3;
    if ((local_148 & 1) == 0) {
      (this->super_Parser<bioparser::test::SamOverlap>).buffer_ptr_ = 0;
      pcVar2 = (this->super_Parser<bioparser::test::SamOverlap>).buffer_.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = gzread((this->super_Parser<bioparser::test::SamOverlap>).file_._M_t.
                     super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
                     super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
                     super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl,pcVar2,
                     *(int *)&(this->super_Parser<bioparser::test::SamOverlap>).buffer_.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish - (int)pcVar2);
      (this->super_Parser<bioparser::test::SamOverlap>).buffer_bytes_ = uVar6;
      local_148 = (ulong)CONCAT31((int3)(uVar6 >> 8),
                                  (ulong)uVar6 <
                                  (ulong)((long)(this->super_Parser<bioparser::test::SamOverlap>).
                                                buffer_.
                                                super__Vector_base<char,_std::allocator<char>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->super_Parser<bioparser::test::SamOverlap>).
                                               buffer_.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.super__Vector_impl_data._M_start));
      iVar4 = 0;
    }
LAB_00118879:
    if (iVar4 != 0) {
      if ((iVar4 == 3) &&
         (bVar5 = true, (this->super_Parser<bioparser::test::SamOverlap>).storage_ptr_ != 0)) {
        Parse::anon_class_168_21_4e792969::operator()(&local_d8);
      }
      if (!bVar5) {
        std::
        vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
        ::~vector(local_150);
      }
      return local_150;
    }
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;

    const char* q_name = nullptr;
    std::uint32_t q_name_len = 0;
    std::uint32_t flag = 0;
    const char* t_name = nullptr;
    std::uint32_t t_name_len = 0;
    std::uint32_t t_begin = 0;
    std::uint32_t map_quality = 0;
    const char* cigar = nullptr;
    std::uint32_t cigar_len = 0;
    const char* t_next_name = nullptr;
    std::uint32_t t_next_name_len = 0;
    std::uint32_t t_next_begin = 0;
    std::uint32_t template_len = 0;
    const char* data = nullptr;
    std::uint32_t data_len = 0;
    const char* quality = nullptr;
    std::uint32_t quality_len = 0;

    auto create_T = [&] () -> void {
      if (this->storage()[0] == '@') {  // file header
        this->Clear();
        return;
      }
      auto storage_ptr = this->RightStrip(
          this->storage().data(),
          this->storage_ptr());
      this->Terminate(storage_ptr);

      std::uint32_t num_values = 0;
      std::uint32_t begin_ptr = 0;
      while (true) {
        auto end_ptr = begin_ptr;
        while (end_ptr < storage_ptr && this->storage()[end_ptr] != '\t') {
          ++end_ptr;
        }
        this->Terminate(end_ptr);

        switch (num_values) {
          case 0:
            q_name = this->storage().data() + begin_ptr;
            q_name_len = end_ptr - begin_ptr;
            break;
          case 1: flag = std::atoi(this->storage().data() + begin_ptr); break;
          case 2:
            t_name = this->storage().data() + begin_ptr;
            t_name_len = end_ptr - begin_ptr;
            break;
          case 3: t_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 4: map_quality = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 5:
            cigar = this->storage().data() + begin_ptr;
            cigar_len = end_ptr - begin_ptr;
            break;
          case 6:
            t_next_name = this->storage().data() + begin_ptr;
            t_next_name_len = end_ptr - begin_ptr;
            break;
          case 7: t_next_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 8: template_len = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 9:
            data = this->storage().data() + begin_ptr;
            data_len = end_ptr - begin_ptr;
            break;
          case 10:
            quality = this->storage().data() + begin_ptr;
            quality_len = end_ptr - begin_ptr;
            break;
          default: break;
        }

        ++num_values;
        if (end_ptr == storage_ptr || num_values == 11) {
          break;
        }
        begin_ptr = end_ptr + 1;
      }

      if (num_values != 11) {
        throw std::invalid_argument(
            "[bioparser::SamParser] error: invalid file format");
      }

      q_name_len = shorten_names ?
          this->Shorten(q_name, q_name_len) :
          this->RightStrip(q_name, q_name_len);

      t_name_len = shorten_names ?
          this->Shorten(t_name, t_name_len) :
          this->RightStrip(t_name, t_name_len);

      cigar_len = this->RightStrip(cigar, cigar_len);

      t_next_name_len = shorten_names ?
          this->Shorten(t_next_name, t_next_name_len) :
          this->RightStrip(t_next_name, t_next_name_len);

      data_len = this->RightStrip(data, data_len);
      quality_len = this->RightStrip(quality, quality_len);

      if (q_name_len == 0 || t_name_len == 0 || cigar_len == 0 ||
          t_next_name_len == 0 || data_len == 0 || quality_len == 0 ||
          (data_len > 1 && quality_len > 1 && data_len != quality_len)) {
        throw std::invalid_argument(
            "[bioparser::SamParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          q_name, q_name_len,
          flag,
          t_name, t_name_len, t_begin,
          map_quality,
          cigar, cigar_len,
          t_next_name, t_next_name_len, t_next_begin,
          template_len,
          data, data_len,
          quality, quality_len)));

      parsed_bytes += this->storage_ptr();
      this->Clear();
    };

    bool is_eof = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr());
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr());
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }